

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_types.h
# Opt level: O2

Rule * __thiscall Potassco::RuleBuilder::unfreeze(RuleBuilder *this,bool discard)

{
  Rule *pRVar1;
  uint uVar2;
  
  pRVar1 = (Rule *)(this->mem_).beg_;
  if (-1 < (int)*(uint *)pRVar1) {
    return pRVar1;
  }
  if (discard) {
    pRVar1->head = (Span)0x0;
    pRVar1->body = (Span)0x0;
    uVar2 = 0x14;
  }
  else {
    uVar2 = *(uint *)pRVar1 & 0x7fffffff;
  }
  *(uint *)pRVar1 = uVar2;
  return pRVar1;
}

Assistant:

void*       begin()    const { return beg_; }